

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Scatter_flat(int g_a,void *v,int *subsArray,int n)

{
  Integer IVar1;
  void *subscript;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  
  IVar1 = pnga_ndim((long)g_a);
  subscript = malloc((long)((int)IVar1 * n) << 3);
  if (subscript == (void *)0x0) {
    pnga_error("Memory allocation failed.",0);
  }
  uVar2 = 0;
  lVar3 = 0;
  if (0 < IVar1) {
    lVar3 = IVar1;
  }
  uVar4 = 0;
  if (0 < n) {
    uVar4 = (ulong)(uint)n;
  }
  lVar5 = (long)subscript + IVar1 * 8 + -8;
  for (; uVar2 != uVar4; uVar2 = uVar2 + 1) {
    piVar6 = subsArray;
    for (lVar7 = 0; -lVar7 != lVar3; lVar7 = lVar7 + -1) {
      *(long *)(lVar5 + lVar7 * 8) = (long)*piVar6 + 1;
      piVar6 = piVar6 + 1;
    }
    subsArray = subsArray + IVar1;
    lVar5 = lVar5 + IVar1 * 8;
  }
  pnga_scatter((long)g_a,v,subscript,0,(long)n);
  free(subscript);
  return;
}

Assistant:

void NGA_Scatter_flat(int g_a, void *v, int subsArray[], int n)
{
    int idx, i;
    Integer a = (Integer)g_a;
    Integer nv = (Integer)n;
    Integer ndim = wnga_ndim(a);
    Integer *_subs_array;
    _subs_array = (Integer *)malloc((int)ndim* n * sizeof(Integer));
    if(_subs_array == NULL) GA_Error("Memory allocation failed.", 0);

    /* adjust the indices for fortran interface */
    for(idx=0; idx<n; idx++)
        for(i=0; i<ndim; i++)
            _subs_array[idx*ndim+(ndim-i-1)] = subsArray[idx*ndim+i] + 1;
    
    wnga_scatter(a, v, _subs_array, 0, nv);
    
    free(_subs_array);
}